

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_bclr_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  undefined1 auVar1 [16];
  char cVar2;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined1 auVar3 [16];
  char cVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  auVar3 = psllw((undefined1  [16])(env->active_fpu).fpr[wt],5);
  auVar3 = auVar3 & _DAT_00b902b0;
  cVar2 = auVar3[0];
  cVar4 = auVar3[1];
  cVar5 = auVar3[2];
  cVar6 = auVar3[3];
  cVar7 = auVar3[4];
  cVar8 = auVar3[5];
  cVar9 = auVar3[6];
  cVar10 = auVar3[7];
  cVar11 = auVar3[8];
  cVar12 = auVar3[9];
  cVar13 = auVar3[10];
  cVar14 = auVar3[0xb];
  cVar15 = auVar3[0xc];
  cVar16 = auVar3[0xd];
  cVar17 = auVar3[0xe];
  cVar18 = auVar3[0xf];
  auVar3[0] = (-(cVar2 < '\0') & 0x10U) + -(cVar2 < '\0') + '\x01';
  auVar3[1] = (-(cVar4 < '\0') & 0x10U) + -(cVar4 < '\0') + '\x01';
  auVar3[2] = (-(cVar5 < '\0') & 0x10U) + -(cVar5 < '\0') + '\x01';
  auVar3[3] = (-(cVar6 < '\0') & 0x10U) + -(cVar6 < '\0') + '\x01';
  auVar3[4] = (-(cVar7 < '\0') & 0x10U) + -(cVar7 < '\0') + '\x01';
  auVar3[5] = (-(cVar8 < '\0') & 0x10U) + -(cVar8 < '\0') + '\x01';
  auVar3[6] = (-(cVar9 < '\0') & 0x10U) + -(cVar9 < '\0') + '\x01';
  auVar3[7] = (-(cVar10 < '\0') & 0x10U) + -(cVar10 < '\0') + '\x01';
  auVar3[8] = (-(cVar11 < '\0') & 0x10U) + -(cVar11 < '\0') + '\x01';
  auVar3[9] = (-(cVar12 < '\0') & 0x10U) + -(cVar12 < '\0') + '\x01';
  auVar3[10] = (-(cVar13 < '\0') & 0x10U) + -(cVar13 < '\0') + '\x01';
  auVar3[0xb] = (-(cVar14 < '\0') & 0x10U) + -(cVar14 < '\0') + '\x01';
  auVar3[0xc] = (-(cVar15 < '\0') & 0x10U) + -(cVar15 < '\0') + '\x01';
  auVar3[0xd] = (-(cVar16 < '\0') & 0x10U) + -(cVar16 < '\0') + '\x01';
  auVar3[0xe] = (-(cVar17 < '\0') & 0x10U) + -(cVar17 < '\0') + '\x01';
  auVar3[0xf] = (-(cVar18 < '\0') & 0x10U) + -(cVar18 < '\0') + '\x01';
  auVar20[0] = -((char)(cVar2 * '\x02') < '\0');
  auVar20[1] = -((char)(cVar4 * '\x02') < '\0');
  auVar20[2] = -((char)(cVar5 * '\x02') < '\0');
  auVar20[3] = -((char)(cVar6 * '\x02') < '\0');
  auVar20[4] = -((char)(cVar7 * '\x02') < '\0');
  auVar20[5] = -((char)(cVar8 * '\x02') < '\0');
  auVar20[6] = -((char)(cVar9 * '\x02') < '\0');
  auVar20[7] = -((char)(cVar10 * '\x02') < '\0');
  auVar20[8] = -((char)(cVar11 * '\x02') < '\0');
  auVar20[9] = -((char)(cVar12 * '\x02') < '\0');
  auVar20[10] = -((char)(cVar13 * '\x02') < '\0');
  auVar20[0xb] = -((char)(cVar14 * '\x02') < '\0');
  auVar20[0xc] = -((char)(cVar15 * '\x02') < '\0');
  auVar20[0xd] = -((char)(cVar16 * '\x02') < '\0');
  auVar20[0xe] = -((char)(cVar17 * '\x02') < '\0');
  auVar20[0xf] = -((char)(cVar18 * '\x02') < '\0');
  auVar1 = psllw(auVar3,2);
  auVar3 = auVar1 & auVar20 & _DAT_00b902d0 | ~auVar20 & auVar3;
  auVar19[0] = -((char)(cVar2 << 2) < '\0');
  auVar19[1] = -((char)(cVar4 << 2) < '\0');
  auVar19[2] = -((char)(cVar5 << 2) < '\0');
  auVar19[3] = -((char)(cVar6 << 2) < '\0');
  auVar19[4] = -((char)(cVar7 << 2) < '\0');
  auVar19[5] = -((char)(cVar8 << 2) < '\0');
  auVar19[6] = -((char)(cVar9 << 2) < '\0');
  auVar19[7] = -((char)(cVar10 << 2) < '\0');
  auVar19[8] = -((char)(cVar11 << 2) < '\0');
  auVar19[9] = -((char)(cVar12 << 2) < '\0');
  auVar19[10] = -((char)(cVar13 << 2) < '\0');
  auVar19[0xb] = -((char)(cVar14 << 2) < '\0');
  auVar19[0xc] = -((char)(cVar15 << 2) < '\0');
  auVar19[0xd] = -((char)(cVar16 << 2) < '\0');
  auVar19[0xe] = -((char)(cVar17 << 2) < '\0');
  auVar19[0xf] = -((char)(cVar18 << 2) < '\0');
  auVar1[1] = auVar3[1] * '\x02';
  auVar1[0] = auVar3[0] * '\x02';
  auVar1[2] = auVar3[2] * '\x02';
  auVar1[3] = auVar3[3] * '\x02';
  auVar1[4] = auVar3[4] * '\x02';
  auVar1[5] = auVar3[5] * '\x02';
  auVar1[6] = auVar3[6] * '\x02';
  auVar1[7] = auVar3[7] * '\x02';
  auVar1[8] = auVar3[8] * '\x02';
  auVar1[9] = auVar3[9] * '\x02';
  auVar1[10] = auVar3[10] * '\x02';
  auVar1[0xb] = auVar3[0xb] * '\x02';
  auVar1[0xc] = auVar3[0xc] * '\x02';
  auVar1[0xd] = auVar3[0xd] * '\x02';
  auVar1[0xe] = auVar3[0xe] * '\x02';
  auVar1[0xf] = auVar3[0xf] * '\x02';
  (env->active_fpu).fpr[wd] =
       (fpr_t)(~(auVar1 & auVar19 | ~auVar19 & auVar3) & (undefined1  [16])(env->active_fpu).fpr[ws]
              );
  return;
}

Assistant:

void helper_msa_bclr_b(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_bclr_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_bclr_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_bclr_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_bclr_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_bclr_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_bclr_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_bclr_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_bclr_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_bclr_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_bclr_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_bclr_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_bclr_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_bclr_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_bclr_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_bclr_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_bclr_df(DF_BYTE, pws->b[15], pwt->b[15]);
}